

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# incppect.cpp
# Opt level: O3

void __thiscall Incppect<false>::stop(Incppect<false> *this)

{
  Loop *this_00;
  void *storage;
  type local_28;
  vtable<fu2::abi_400::detail::property<true,_false,_void_()>_> local_18;
  
  this_00 = ((this->m_impl)._M_t.
             super___uniq_ptr_impl<Incppect<false>::Impl,_std::default_delete<Incppect<false>::Impl>_>
             ._M_t.
             super__Tuple_impl<0UL,_Incppect<false>::Impl_*,_std::default_delete<Incppect<false>::Impl>_>
             .super__Head_base<0UL,_Incppect<false>::Impl_*,_false>._M_head_impl)->mainLoop;
  if (this_00 != (Loop *)0x0) {
    local_18.vtable_ =
         fu2::abi_400::detail::type_erasure::invocation_table::function_trait<void_()>::
         internal_invoker<fu2::abi_400::detail::type_erasure::box<false,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]imgui-ws/third-party/incppect/src/incppect.cpp:534:33),_std::allocator<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]imgui-ws/third-party/incppect/src/incppect.cpp:534:33)>_>,_true>
         ::invoke;
    local_18.cmd_ =
         fu2::abi_400::detail::type_erasure::tables::
         vtable<fu2::abi_400::detail::property<true,_false,_void_()>_>::
         trait<fu2::abi_400::detail::type_erasure::box<false,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]imgui-ws/third-party/incppect/src/incppect.cpp:534:33),_std::allocator<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]imgui-ws/third-party/incppect/src/incppect.cpp:534:33)>_>_>
         ::process_cmd<true>;
    local_28.accessor_ = (data_accessor)this;
    uWS::Loop::defer(this_00,(unique_function<void_()> *)&local_28);
    (*local_18.cmd_)(&local_18,op_weak_destroy,&local_28.accessor_,0x10,(data_accessor *)0x0,0);
  }
  return;
}

Assistant:

void Incppect<SSL>::stop() {
    if (m_impl->mainLoop != nullptr) {
        m_impl->mainLoop->defer([this]() {
            for (auto sd : m_impl->socketData) {
                if (sd.second->mainLoop != nullptr) {
                    sd.second->mainLoop->defer([sd]() {
                        sd.second->ws->close();
                    });
                }
            }
            us_listen_socket_close(0, m_impl->listenSocket);
        });
    }
}